

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::ModelProto::ModelProto(ModelProto *this,Arena *arena)

{
  Arena *in_RSI;
  ModelProto *in_RDI;
  Arena *in_stack_00000008;
  ExtensionSet *in_stack_00000010;
  Arena *in_stack_ffffffffffffffa8;
  MessageLite *in_stack_ffffffffffffffb0;
  ModelProto *this_00;
  HasBits<1UL> *local_40;
  
  google::protobuf::MessageLite::MessageLite(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  (in_RDI->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ModelProto_006f1250;
  google::protobuf::internal::ExtensionSet::ExtensionSet(in_stack_00000010,in_stack_00000008);
  local_40 = &in_RDI->_has_bits_;
  do {
    local_40->has_bits_[0] = 0;
    local_40 = local_40 + 1;
  } while (local_40 != (HasBits<1UL> *)&in_RDI->_cached_size_);
  google::protobuf::internal::CachedSize::CachedSize((CachedSize *)0x46147c);
  this_00 = (ModelProto *)&in_RDI->pieces_;
  google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::RepeatedPtrField
            ((RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *)this_00,
             in_stack_ffffffffffffffa8);
  SharedCtor(this_00);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

ModelProto::ModelProto(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena),
  _extensions_(arena),
  pieces_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:sentencepiece.ModelProto)
}